

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_result_modifier.cpp
# Opt level: O2

idx_t __thiscall duckdb::BoundLimitNode::GetConstantValue(BoundLimitNode *this)

{
  InternalException *this_00;
  allocator local_39;
  string local_38;
  
  if (this->type == CONSTANT_VALUE) {
    return this->constant_integer;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,
             "BoundLimitNode::GetConstantValue called but limit is not a constant value",&local_39);
  InternalException::InternalException(this_00,&local_38);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

idx_t BoundLimitNode::GetConstantValue() const {
	if (Type() != LimitNodeType::CONSTANT_VALUE) {
		throw InternalException("BoundLimitNode::GetConstantValue called but limit is not a constant value");
	}
	return constant_integer;
}